

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

FILE * testing::internal::OpenFileForWriting(string *output_file)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  bool bVar4;
  FILE *pFVar5;
  ostream *poVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  FilePath output_file_path;
  FilePath output_dir;
  GTestLog local_84;
  FilePath local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  long local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  FilePath local_40;
  
  pcVar2 = (output_file->_M_dataplus)._M_p;
  local_60 = &local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar2,pcVar2 + output_file->_M_string_length);
  lVar3 = local_58;
  paVar1 = &local_80.pathname_.field_2;
  local_80.pathname_._M_dataplus._M_p = (pointer)local_60;
  if (local_60 == &local_50) {
    local_80.pathname_.field_2._8_8_ = local_50._8_8_;
    local_80.pathname_._M_dataplus._M_p = (pointer)paVar1;
  }
  local_80.pathname_.field_2._M_allocated_capacity._1_7_ = local_50._M_allocated_capacity._1_7_;
  local_80.pathname_.field_2._M_local_buf[0] = local_50._M_local_buf[0];
  local_60 = &local_50;
  local_58 = 0;
  local_50._M_local_buf[0] = '\0';
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_80.pathname_._M_dataplus._M_p;
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_80.pathname_._M_dataplus._M_p;
  if (lVar3 != 0) {
    do {
      if ((paVar7 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_80.pathname_._M_dataplus._M_p || paVar8->_M_local_buf[0] != '/') ||
         (paVar7->_M_local_buf[-1] != '/')) {
        paVar7->_M_local_buf[0] = paVar8->_M_local_buf[0];
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(paVar7->_M_local_buf + 1);
      }
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(paVar8->_M_local_buf + 1);
    } while (paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(local_80.pathname_._M_dataplus._M_p + lVar3));
  }
  local_80.pathname_._M_string_length = (long)paVar7 - (long)local_80.pathname_._M_dataplus._M_p;
  paVar7->_M_local_buf[0] = '\0';
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(local_50._M_allocated_capacity._1_7_,local_50._M_local_buf[0])
                             + 1);
  }
  FilePath::RemoveFileName(&local_40,&local_80);
  bVar4 = FilePath::CreateDirectoriesRecursively(&local_40);
  if ((!bVar4) || (pFVar5 = fopen((output_file->_M_dataplus)._M_p,"w"), pFVar5 == (FILE *)0x0)) {
    GTestLog::GTestLog(&local_84,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O3/_deps/gtest-src/googletest/src/gtest.cc"
                       ,0xe4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Unable to open file \"",0x15);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(output_file->_M_dataplus)._M_p,
                        output_file->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
    GTestLog::~GTestLog(&local_84);
    pFVar5 = (FILE *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.pathname_._M_dataplus._M_p != &local_40.pathname_.field_2) {
    operator_delete(local_40.pathname_._M_dataplus._M_p,
                    local_40.pathname_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.pathname_._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.pathname_._M_dataplus._M_p,
                    local_80.pathname_.field_2._M_allocated_capacity + 1);
  }
  return (FILE *)pFVar5;
}

Assistant:

static FILE* OpenFileForWriting(const std::string& output_file) {
  FILE* fileout = nullptr;
  FilePath output_file_path(output_file);
  FilePath output_dir(output_file_path.RemoveFileName());

  if (output_dir.CreateDirectoriesRecursively()) {
    fileout = posix::FOpen(output_file.c_str(), "w");
  }
  if (fileout == nullptr) {
    GTEST_LOG_(FATAL) << "Unable to open file \"" << output_file << "\"";
  }
  return fileout;
}